

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O2

bool __thiscall duckdb::NestedValidity::IsValid(NestedValidity *this,idx_t idx)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  
  if (this->list_validity_location == (data_ptr_t)0x0) {
    bVar2 = (byte)this->idx_in_entry;
    pbVar1 = this->struct_validity_locations[idx] + this->entry_idx;
  }
  else {
    uVar3 = idx + this->list_validity_offset;
    bVar2 = (byte)uVar3 & 7;
    pbVar1 = this->list_validity_location + (uVar3 >> 3);
  }
  return ((uint)(1L << (bVar2 & 0x3f)) & (uint)*pbVar1) != 0;
}

Assistant:

bool NestedValidity::IsValid(idx_t idx) {
	if (list_validity_location) {
		// Is List

		idx = idx + list_validity_offset;

		idx_t list_entry_idx;
		idx_t list_idx_in_entry;
		ValidityBytes::GetEntryIndex(idx, list_entry_idx, list_idx_in_entry);
		const auto bit = (1UL << list_idx_in_entry);
		return list_validity_location[list_entry_idx] & bit;
	} else {
		// Is Struct
		const auto bit = (1UL << idx_in_entry);
		return *(struct_validity_locations[idx] + entry_idx) & bit;
	}
}